

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearForce.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearForce::IntLoadResidual_F
          (ChLinkMotorLinearForce *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 in_register_00000034;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double c_local;
  Vector mbody_torque;
  Vector m_abs_force;
  Vector mbody_force;
  ChVector<double> local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_1a0;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_170;
  ChVector<double> *local_138 [2];
  ChFrame<double> aframe1;
  ChFrame<double> aframe2;
  
  peVar7 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar9 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate
          .super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  c_local = c;
  (*peVar7->_vptr_ChFunction[4])(peVar7,CONCAT44(in_register_00000034,off));
  ChFrame<double>::operator>>
            (&aframe1,&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&aframe2,&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar9;
  auVar10 = ZEXT816(0) << 0x40;
  mbody_torque.m_data[0] = 0.0;
  mbody_force.m_data[2] = 0.0;
  mbody_torque.m_data[2] = 0.0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar1 = vfmadd231sd_fma(auVar11,auVar13,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar12,auVar13,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar10,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar10,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar14,auVar13,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar10,auVar6);
  mbody_force.m_data[1] = 0.0;
  mbody_torque.m_data[1] = 0.0;
  m_abs_force.m_data[0] = auVar1._0_8_;
  m_abs_force.m_data[1] = auVar2._0_8_;
  m_abs_force.m_data[2] = auVar3._0_8_;
  mbody_force.m_data[0] = mbody_torque.m_data[0];
  iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar8) + 0x2c) == '\0') {
    ChBodyFrame::To_abs_forcetorque
              ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2,&m_abs_force,&aframe1.coord.pos,false,
               &mbody_force,&mbody_torque);
    local_1b8.m_data[0] = (double)&mbody_force;
    Eigen::operator*(&local_1a0,&c_local,(StorageBaseType *)&local_1b8);
    iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_170,R,(long)*(int *)(CONCAT44(extraout_var_00,iVar8) + 0x30),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_170,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_1b8,
               (ChFrame<double> *)
               (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2,&mbody_torque);
    local_138[0] = &local_1b8;
    Eigen::operator*(&local_1a0,&c_local,(StorageBaseType *)local_138);
    iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_170,R,(long)*(int *)(CONCAT44(extraout_var_01,iVar8) + 0x30) + 3,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_170,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
  }
  iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_02,iVar8) + 0x2c) == '\0') {
    ChBodyFrame::To_abs_forcetorque
              ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1,&m_abs_force,&aframe1.coord.pos,false,
               &mbody_force,&mbody_torque);
    local_1b8.m_data[0] = (double)&mbody_force;
    Eigen::operator*(&local_1a0,&c_local,(StorageBaseType *)&local_1b8);
    iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_170,R,(long)*(int *)(CONCAT44(extraout_var_03,iVar8) + 0x30),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_170,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_1b8,
               (ChFrame<double> *)
               (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1,&mbody_torque);
    local_138[0] = &local_1b8;
    Eigen::operator*(&local_1a0,&c_local,(StorageBaseType *)local_138);
    iVar8 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_170,R,(long)*(int *)(CONCAT44(extraout_var_04,iVar8) + 0x30) + 3,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_170,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_1a0);
  }
  return;
}

Assistant:

void ChLinkMotorLinearForce::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    // compute instant force
    double mF = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_force = aframe2.GetA() * ChVector<>(mF, 0, 0);
    Vector mbody_force;
    Vector mbody_torque;

    if (Body2->Variables().IsActive()) {
        Body2->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
        R.segment(Body2->Variables().GetOffset() + 3, 3) -=
            c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Body1->Variables().IsActive()) {
        Body1->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
        R.segment(Body1->Variables().GetOffset() + 3, 3) +=
            c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }
}